

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O3

void start_subcommand(strbuf *args)

{
  char cVar1;
  int iVar2;
  __pid_t _Var3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  void *unaff_R14;
  char *__s;
  long lVar9;
  
  iVar2 = pipe(signalpipe);
  if (iVar2 < 0) {
    start_subcommand_cold_3();
  }
  else {
    putty_signal(0x11,sigchld);
    if (args->len == 0) {
      unaff_R14 = safemalloc(1,8,0);
      lVar9 = 0;
    }
    else {
      sVar5 = 0;
      lVar8 = 0;
      do {
        lVar7 = lVar8;
        cVar1 = args->s[sVar5];
        lVar8 = lVar7 + (ulong)(cVar1 == '\0');
        sVar5 = sVar5 + 1;
      } while (args->len != sVar5);
      unaff_R14 = safemalloc(lVar8 + 1,8,0);
      lVar9 = 0;
      if (lVar8 != 0) {
        __s = args->s;
        sVar5 = args->len;
        lVar6 = 0;
        do {
          *(char **)((long)unaff_R14 + lVar6 * 8) = __s;
          pcVar4 = (char *)strlen(__s);
          if (args->s + (sVar5 - (long)__s) <= pcVar4) {
            __assert_fail("len < args->len - (p - args->s)",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/psocks.c"
                          ,0x6f,"void start_subcommand(strbuf *)");
          }
          __s = __s + (long)(pcVar4 + 1);
          lVar6 = lVar6 + 1;
          lVar9 = lVar8;
        } while (lVar7 + (ulong)(cVar1 == '\0') != lVar6);
      }
    }
    *(undefined8 *)((long)unaff_R14 + lVar9 * 8) = 0;
    _Var3 = fork();
    if (-1 < _Var3) {
      if (_Var3 != 0) {
        subcommand_pid = _Var3;
        safefree(unaff_R14);
        return;
      }
      goto LAB_0010435b;
    }
  }
  start_subcommand_cold_2();
LAB_0010435b:
  start_subcommand_cold_1();
  pclose(*(FILE **)((long)unaff_R14 + -0x40));
  pclose(*(FILE **)((long)unaff_R14 + -0x20));
  safefree((void *)((long)unaff_R14 + -0x40));
  return;
}

Assistant:

static void start_subcommand(strbuf *args)
{
    pid_t pid;

    /*
     * Set up the pipe we'll use to tell us about SIGCHLD.
     */
    if (pipe(signalpipe) < 0) {
        perror("pipe");
        exit(1);
    }
    putty_signal(SIGCHLD, sigchld);

    /*
     * Make an array of argument pointers that execvp will like.
     */
    size_t nargs = 0;
    for (size_t i = 0; i < args->len; i++)
        if (args->s[i] == '\0')
            nargs++;

    char **exec_args = snewn(nargs + 1, char *);
    char *p = args->s;
    for (size_t a = 0; a < nargs; a++) {
        exec_args[a] = p;
        size_t len = strlen(p);
        assert(len < args->len - (p - args->s));
        p += 1 + len;
    }
    exec_args[nargs] = NULL;

    pid = fork();
    if (pid < 0) {
        perror("fork");
        exit(1);
    } else if (pid == 0) {
        execvp(exec_args[0], exec_args);
        perror("exec");
        _exit(127);
    } else {
        subcommand_pid = pid;
        sfree(exec_args);
    }
}